

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQInteger __thiscall SQFuncState::PushTarget(SQFuncState *this,SQInteger n)

{
  ulong uVar1;
  longlong *p;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  
  if (n == -1) {
    n = AllocStackPos(this);
  }
  uVar1 = (this->_targetstack)._allocated;
  p = (this->_targetstack)._vals;
  uVar2 = (this->_targetstack)._size;
  if (uVar1 <= uVar2) {
    SVar3 = 4;
    if (uVar2 * 2 != 0) {
      SVar3 = uVar2 * 2;
    }
    p = (longlong *)sq_vm_realloc(p,uVar1 << 3,SVar3 * 8);
    (this->_targetstack)._vals = p;
    (this->_targetstack)._allocated = SVar3;
    uVar2 = (this->_targetstack)._size;
  }
  (this->_targetstack)._size = uVar2 + 1;
  p[uVar2] = n;
  return n;
}

Assistant:

SQInteger SQFuncState::PushTarget(SQInteger n)
{
    if(n!=-1){
        _targetstack.push_back(n);
        return n;
    }
    n=AllocStackPos();
    _targetstack.push_back(n);
    return n;
}